

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall
ADPlanner::InitializeSearchStateInfo
          (ADPlanner *this,ADState *state,ADSearchStateSpace_t *pSearchStateSpace)

{
  int iVar1;
  
  *(undefined8 *)(state + 0x20) = 0x3b9aca003b9aca00;
  *(undefined2 *)(state + 0x28) = 0;
  *(unsigned_short *)(state + 0x2a) = pSearchStateSpace->callnumber;
  *(undefined4 *)(state + 0x40) = 1000000000;
  *(undefined4 *)(state + 0x10) = 0;
  *(undefined8 *)state = 0;
  *(undefined8 *)(state + 0x30) = 0;
  *(undefined8 *)(state + 0x38) = 0;
  if (pSearchStateSpace->searchgoalstate == (CMDPSTATE *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,*(undefined8 *)(state + 0x18))
    ;
  }
  *(int *)(state + 0x44) = iVar1;
  return;
}

Assistant:

void ADPlanner::InitializeSearchStateInfo(ADState* state, ADSearchStateSpace_t* pSearchStateSpace)
{
    state->g = INFINITECOST;
    state->v = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->bestnextstate = NULL;
    state->costtobestnextstate = INFINITECOST;
    state->heapindex = 0;
    state->listelem[AD_INCONS_LIST_ID] = NULL;
#if DEBUG
    state->numofexpands = 0;
#endif
    state->bestpredstate = NULL;

    //compute heuristics
#if USE_HEUR
    if(pSearchStateSpace->searchgoalstate != NULL)
    state->h = ComputeHeuristic(state->MDPstate, pSearchStateSpace);
    else
    state->h = 0;
#else
    state->h = 0;
#endif
}